

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::SetDOMWrapperTracingCallback
          (Recycler *this,void *state,DOMWrapperTracingCallback tracingCallback,
          DOMWrapperTracingDoneCallback tracingDoneCallback,
          DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  RecyclerCollectionWrapper *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (state == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232e,"(state)","state");
    if (!bVar3) goto LAB_00718fc0;
    *puVar4 = 0;
  }
  if (tracingCallback == (DOMWrapperTracingCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x232f,"(tracingCallback)","tracingCallback");
    if (!bVar3) goto LAB_00718fc0;
    *puVar4 = 0;
  }
  if (enterFinalPauseCallback == (DOMWrapperTracingEnterFinalPauseCallback)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2330,"(enterFinalPauseCallback)","enterFinalPauseCallback");
    if (!bVar3) {
LAB_00718fc0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pRVar1 = this->collectionWrapper;
  pRVar1->wrapperTracingCallbackState = state;
  pRVar1->wrapperTracingCallback = tracingCallback;
  pRVar1->wrapperTracingDoneCallback = tracingDoneCallback;
  pRVar1->wrapperTracingEnterFinalPauseCallback = enterFinalPauseCallback;
  return;
}

Assistant:

void Recycler::SetDOMWrapperTracingCallback(void * state, DOMWrapperTracingCallback tracingCallback, DOMWrapperTracingDoneCallback tracingDoneCallback, DOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    Assert(state);
    Assert(tracingCallback);
    Assert(enterFinalPauseCallback);
    this->collectionWrapper->SetWrapperTracingCallbackState(state);
    this->collectionWrapper->SetDOMWrapperTracingCallback(tracingCallback);
    this->collectionWrapper->SetDOMWrapperTracingDoneCallback(tracingDoneCallback);
    this->collectionWrapper->SetDOMWrapperTracingEnterFinalPauseCallback(enterFinalPauseCallback);
}